

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

CURLcode Curl_conn_recv(Curl_easy *data,int sockindex,char *buf,size_t blen,ssize_t *n)

{
  uint in_EAX;
  ssize_t sVar1;
  ssize_t sVar2;
  CURLcode result;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  sVar1 = (*data->conn->recv[sockindex])(data,sockindex,buf,blen,(CURLcode *)((long)&uStack_18 + 4))
  ;
  sVar2 = 0;
  if (0 < sVar1) {
    sVar2 = sVar1;
  }
  *n = sVar2;
  return uStack_18._4_4_;
}

Assistant:

CURLcode Curl_conn_recv(struct Curl_easy *data, int sockindex,
                        char *buf, size_t blen, ssize_t *n)
{
  CURLcode result = CURLE_OK;
  ssize_t nread;

  DEBUGASSERT(data->conn);
  nread = data->conn->recv[sockindex](data, sockindex, buf, blen, &result);
  DEBUGASSERT(nread >= 0 || result);
  DEBUGASSERT(nread < 0 || !result);
  *n = (nread >= 0) ? (size_t)nread : 0;
  return result;
}